

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_metric_space_gradation(REF_DBL *metric,REF_GRID ref_grid,REF_DBL r)

{
  int node_00;
  int node_01;
  uint uVar1;
  REF_STATUS RVar2;
  void *__ptr;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_INT i;
  REF_INT node;
  REF_DBL limited [6];
  REF_DBL limit_metric [6];
  REF_DBL direction [3];
  REF_DBL log_r;
  REF_DBL enlarge;
  REF_DBL ratio;
  REF_DBL *metric_orig;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_DBL r_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_edge = (REF_EDGE)ref_grid->node;
  ref_node = (REF_NODE)r;
  r_local = (REF_DBL)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  dVar3 = log(r);
  uVar1 = ref_edge_create((REF_EDGE *)&metric_orig,(REF_GRID)r_local);
  if (uVar1 == 0) {
    if (*(int *)(*(long *)((long)r_local + 8) + 4) * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2e7,"ref_metric_metric_space_gradation","malloc metric_orig of REF_DBL negative");
      metric_local._4_4_ = 1;
    }
    else {
      __ptr = malloc((long)(*(int *)(*(long *)((long)r_local + 8) + 4) * 6) << 3);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x2e7,"ref_metric_metric_space_gradation","malloc metric_orig of REF_DBL NULL");
        metric_local._4_4_ = 2;
      }
      else {
        for (edge = 0; edge < *(int *)(*(long *)((long)r_local + 8) + 4); edge = edge + 1) {
          if (((-1 < edge) && (edge < *(int *)(*(long *)((long)r_local + 8) + 4))) &&
             (-1 < *(long *)(*(long *)(*(long *)((long)r_local + 8) + 0x10) + (long)edge * 8))) {
            for (node0 = 0; node0 < 6; node0 = node0 + 1) {
              *(REF_CELL *)((long)__ptr + (long)(node0 + edge * 6) * 8) =
                   ref_grid_local->cell[(long)(node0 + edge * 6) + -2];
            }
          }
        }
        for (node1 = 0; node1 < *(int *)metric_orig; node1 = node1 + 1) {
          node_00 = *(int *)((long)metric_orig[1] + (long)(node1 << 1) * 4);
          node_01 = *(int *)((long)metric_orig[1] + (long)(node1 * 2 + 1) * 4);
          dVar4 = *(double *)(&(ref_edge[1].node)->n + (long)(node_01 * 0xf) * 2) -
                  *(double *)(&(ref_edge[1].node)->n + (long)(node_00 * 0xf) * 2);
          dVar5 = *(double *)(&(ref_edge[1].node)->n + (long)(node_01 * 0xf + 1) * 2) -
                  *(double *)(&(ref_edge[1].node)->n + (long)(node_00 * 0xf + 1) * 2);
          dVar6 = *(double *)(&(ref_edge[1].node)->n + (long)(node_01 * 0xf + 2) * 2) -
                  *(double *)(&(ref_edge[1].node)->n + (long)(node_00 * 0xf + 2) * 2);
          dVar7 = sqrt(dVar6 * (*(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x28) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x10) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x20) * dVar5) +
                       dVar4 * (*(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x10) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 8) * dVar5) +
                       dVar5 * (*(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x20) * dVar6 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 8) * dVar4 +
                               *(double *)((long)__ptr + (long)(node_01 * 6) * 8 + 0x18) * dVar5));
          dVar8 = pow(dVar7 * dVar3 + 1.0,-2.0);
          for (node0 = 0; node0 < 6; node0 = node0 + 1) {
            limited[(long)node0 + 5] =
                 *(double *)((long)__ptr + (long)(node0 + node_01 * 6) * 8) * dVar8;
          }
          RVar2 = ref_matrix_intersect
                            ((REF_DBL *)((long)__ptr + (long)(node_00 * 6) * 8),limited + 5,
                             (REF_DBL *)&i);
          if (RVar2 == 0) {
            RVar2 = ref_matrix_intersect
                              ((REF_DBL *)(ref_grid_local->cell + (long)(node_00 * 6) + -2),
                               (REF_DBL *)&i,
                               (REF_DBL *)(ref_grid_local->cell + (long)(node_00 * 6) + -2));
            if (RVar2 == 0) {
              dVar4 = sqrt(dVar6 * (*(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x28) *
                                    dVar6 + *(double *)
                                             ((long)__ptr + (long)(node_00 * 6) * 8 + 0x10) * dVar4
                                            + *(double *)
                                               ((long)__ptr + (long)(node_00 * 6) * 8 + 0x20) *
                                              dVar5) +
                           dVar4 * (*(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x10) *
                                    dVar6 + *(double *)((long)__ptr + (long)(node_00 * 6) * 8) *
                                            dVar4 + *(double *)
                                                     ((long)__ptr + (long)(node_00 * 6) * 8 + 8) *
                                                    dVar5) +
                           dVar5 * (*(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 0x20) *
                                    dVar6 + *(double *)((long)__ptr + (long)(node_00 * 6) * 8 + 8) *
                                            dVar4 + *(double *)
                                                     ((long)__ptr + (long)(node_00 * 6) * 8 + 0x18)
                                                    * dVar5));
              dVar5 = pow(dVar4 * dVar3 + 1.0,-2.0);
              for (node0 = 0; node0 < 6; node0 = node0 + 1) {
                limited[(long)node0 + 5] =
                     *(double *)((long)__ptr + (long)(node0 + node_00 * 6) * 8) * dVar5;
              }
              RVar2 = ref_matrix_intersect
                                ((REF_DBL *)((long)__ptr + (long)(node_01 * 6) * 8),limited + 5,
                                 (REF_DBL *)&i);
              if (RVar2 == 0) {
                RVar2 = ref_matrix_intersect
                                  ((REF_DBL *)(ref_grid_local->cell + (long)(node_01 * 6) + -2),
                                   (REF_DBL *)&i,
                                   (REF_DBL *)(ref_grid_local->cell + (long)(node_01 * 6) + -2));
                if (RVar2 != 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x31b,"ref_metric_metric_space_gradation","update m1");
                  ref_node_location((REF_NODE)ref_edge,node_01);
                  printf("ratio %24.15e enlarge %24.15e \n",dVar4,dVar5);
                  printf("RECOVER ref_metric_metric_space_gradation\n");
                }
              }
              else {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x313,"ref_metric_metric_space_gradation","limit m1 with enlarged m0");
                ref_node_location((REF_NODE)ref_edge,node_01);
                printf("ratio %24.15e enlarge %24.15e \n",dVar4,dVar5);
                printf("RECOVER ref_metric_metric_space_gradation\n");
              }
            }
            else {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x307,"ref_metric_metric_space_gradation","update m0");
              ref_node_location((REF_NODE)ref_edge,node_00);
              printf("ratio %24.15e enlarge %24.15e \n",dVar7,dVar8);
              printf("RECOVER ref_metric_metric_space_gradation\n");
            }
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x2ff,"ref_metric_metric_space_gradation","limit m0 with enlarged m1");
            ref_node_location((REF_NODE)ref_edge,node_00);
            printf("ratio %24.15e enlarge %24.15e \n",dVar7,dVar8);
            printf("RECOVER ref_metric_metric_space_gradation\n");
          }
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        ref_edge_free((REF_EDGE)metric_orig);
        metric_local._4_4_ =
             ref_node_ghost_dbl(*(REF_NODE *)((long)r_local + 8),(REF_DBL *)ref_grid_local,6);
        if (metric_local._4_4_ == 0) {
          metric_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x327,"ref_metric_metric_space_gradation",(ulong)metric_local._4_4_,"update ghosts"
                );
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x2e5,
           "ref_metric_metric_space_gradation",(ulong)uVar1,"orig edges");
    metric_local._4_4_ = uVar1;
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_metric_space_gradation(REF_DBL *metric,
                                                     REF_GRID ref_grid,
                                                     REF_DBL r) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *metric_orig;
  REF_DBL ratio, enlarge, log_r;
  REF_DBL direction[3];
  REF_DBL limit_metric[6], limited[6];
  REF_INT node, i;
  REF_INT edge, node0, node1;

  log_r = log(r);

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 6; i++) metric_orig[i + 6 * node] = metric[i + 6 * node];
  }

  /* F. Alauzet doi:10.1016/j.finel.2009.06.028 equation (9) */

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    direction[0] =
        (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
    direction[1] =
        (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
    direction[2] =
        (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node1]), direction);
    enlarge = pow(1.0 + ratio * log_r, -2.0);
    for (i = 0; i < 6; i++)
      limit_metric[i] = metric_orig[i + 6 * node1] * enlarge;
    if (REF_SUCCESS != ref_matrix_intersect(&(metric_orig[6 * node0]),
                                            limit_metric, limited)) {
      REF_WHERE("limit m0 with enlarged m1");
      ref_node_location(ref_node, node0);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    if (REF_SUCCESS != ref_matrix_intersect(&(metric[6 * node0]), limited,
                                            &(metric[6 * node0]))) {
      REF_WHERE("update m0");
      ref_node_location(ref_node, node0);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    ratio = ref_matrix_sqrt_vt_m_v(&(metric_orig[6 * node0]), direction);
    enlarge = pow(1.0 + ratio * log_r, -2.0);
    for (i = 0; i < 6; i++)
      limit_metric[i] = metric_orig[i + 6 * node0] * enlarge;
    if (REF_SUCCESS != ref_matrix_intersect(&(metric_orig[6 * node1]),
                                            limit_metric, limited)) {
      REF_WHERE("limit m1 with enlarged m0");
      ref_node_location(ref_node, node1);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
    if (REF_SUCCESS != ref_matrix_intersect(&(metric[6 * node1]), limited,
                                            &(metric[6 * node1]))) {
      REF_WHERE("update m1");
      ref_node_location(ref_node, node1);
      printf("ratio %24.15e enlarge %24.15e \n", ratio, enlarge);
      printf("RECOVER ref_metric_metric_space_gradation\n");
      continue;
    }
  }

  ref_free(metric_orig);

  ref_edge_free(ref_edge);

  RSS(ref_node_ghost_dbl(ref_grid_node(ref_grid), metric, 6), "update ghosts");

  return REF_SUCCESS;
}